

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMLSParserImpl::endElement
          (DOMLSParserImpl *this,XMLElementDecl *elemDecl,uint urlId,bool isRoot,XMLCh *elemPrefix)

{
  DOMNode *key;
  DOMNode *pDVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  FilterAction *pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMLSException *this_00;
  DOMNode *local_80;
  DOMNode *local_78;
  DOMNode *next;
  DOMNode *child;
  FilterAction action;
  DOMNode *thisNode;
  ShowType whatToShow;
  XMLCh *elemPrefix_local;
  bool isRoot_local;
  uint urlId_local;
  XMLElementDecl *elemDecl_local;
  DOMLSParserImpl *this_local;
  
  if (((this->fFilter != (DOMLSParserFilter *)0x0) &&
      (this->fFilterDelayedTextNodes != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) &&
     (bVar2 = ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::containsKey
                        (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode)
     , bVar2)) {
    ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeKey
              (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode);
    applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
  }
  AbstractDOMParser::endElement(&this->super_AbstractDOMParser,elemDecl,urlId,isRoot,elemPrefix);
  if ((this->fFilter != (DOMLSParserFilter *)0x0) &&
     (uVar3 = (*this->fFilter->_vptr_DOMLSParserFilter[4])(), (uVar3 & 1) != 0)) {
    key = (this->super_AbstractDOMParser).fCurrentNode;
    if ((this->fFilterAction ==
         (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)
         0x0) || (bVar2 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                          ::containsKey(this->fFilterAction,key), !bVar2)) {
      child._4_4_ = (*this->fFilter->_vptr_DOMLSParserFilter[2])(this->fFilter,key);
    }
    else {
      pFVar5 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
               ::get(this->fFilterAction,key,XMLPlatformUtils::fgMemoryManager);
      child._4_4_ = *pFVar5;
      ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
      removeKey(this->fFilterAction,key);
    }
    switch(child._4_4_) {
    case FILTER_ACCEPT:
      break;
    case FILTER_REJECT:
      iVar4 = (*key->_vptr_DOMNode[9])();
      if (CONCAT44(extraout_var,iVar4) == 0) {
        local_78 = (this->super_AbstractDOMParser).fCurrentParent;
      }
      else {
        iVar4 = (*key->_vptr_DOMNode[9])();
        local_78 = (DOMNode *)CONCAT44(extraout_var_00,iVar4);
      }
      (this->super_AbstractDOMParser).fCurrentNode = local_78;
      pDVar1 = (this->super_AbstractDOMParser).fCurrentParent;
      (*pDVar1->_vptr_DOMNode[0x10])(pDVar1,key);
      (*key->_vptr_DOMNode[0x27])();
      break;
    case FILTER_SKIP:
      iVar4 = (*key->_vptr_DOMNode[7])();
      next = (DOMNode *)CONCAT44(extraout_var_01,iVar4);
      while (next != (DOMNode *)0x0) {
        iVar4 = (*next->_vptr_DOMNode[10])();
        pDVar1 = (this->super_AbstractDOMParser).fCurrentParent;
        (*pDVar1->_vptr_DOMNode[0x11])(pDVar1,next);
        next = (DOMNode *)CONCAT44(extraout_var_02,iVar4);
      }
      iVar4 = (*key->_vptr_DOMNode[9])();
      if (CONCAT44(extraout_var_03,iVar4) == 0) {
        local_80 = (this->super_AbstractDOMParser).fCurrentParent;
      }
      else {
        iVar4 = (*key->_vptr_DOMNode[9])();
        local_80 = (DOMNode *)CONCAT44(extraout_var_04,iVar4);
      }
      (this->super_AbstractDOMParser).fCurrentNode = local_80;
      pDVar1 = (this->super_AbstractDOMParser).fCurrentParent;
      (*pDVar1->_vptr_DOMNode[0x10])(pDVar1,key);
      (*key->_vptr_DOMNode[0x27])();
      break;
    case FILTER_INTERRUPT:
      this_00 = (DOMLSException *)__cxa_allocate_exception(0x28);
      DOMLSException::DOMLSException
                (this_00,0x51,0x22,(this->super_AbstractDOMParser).fMemoryManager);
      __cxa_throw(this_00,&DOMLSException::typeinfo,DOMLSException::~DOMLSException);
    }
  }
  return;
}

Assistant:

void DOMLSParserImpl::endElement(const XMLElementDecl& elemDecl
                               , const unsigned int    urlId
                               , const bool            isRoot
                               , const XMLCh* const    elemPrefix)
{
    if(fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    AbstractDOMParser::endElement(elemDecl, urlId, isRoot, elemPrefix);
    if(fFilter)
    {
        DOMNodeFilter::ShowType whatToShow=fFilter->getWhatToShow();
        if(whatToShow & DOMNodeFilter::SHOW_ELEMENT)
        {
            DOMNode* thisNode = fCurrentNode;
            DOMLSParserFilter::FilterAction action;
            if(fFilterAction && fFilterAction->containsKey(thisNode))
            {
                action = fFilterAction->get(thisNode);
                fFilterAction->removeKey(thisNode);
            }
            else
                action = fFilter->acceptNode(thisNode);
            switch(action)
            {
            case DOMLSParserFilter::FILTER_ACCEPT:      break;
            case DOMLSParserFilter::FILTER_REJECT:      fCurrentNode = (thisNode->getPreviousSibling()?thisNode->getPreviousSibling():fCurrentParent);
                                                        fCurrentParent->removeChild(thisNode);
                                                        thisNode->release();
                                                        break;
            case DOMLSParserFilter::FILTER_SKIP:        {
                                                            DOMNode* child=thisNode->getFirstChild();
                                                            while(child)
                                                            {
                                                                DOMNode* next=child->getNextSibling();
                                                                fCurrentParent->appendChild(child);
                                                                child=next;
                                                            }
                                                            fCurrentNode = (thisNode->getPreviousSibling()?thisNode->getPreviousSibling():fCurrentParent);
                                                            fCurrentParent->removeChild(thisNode);
                                                            thisNode->release();
                                                        }
                                                        break;
            case DOMLSParserFilter::FILTER_INTERRUPT:   throw DOMLSException(DOMLSException::PARSE_ERR, XMLDOMMsg::LSParser_ParsingAborted, fMemoryManager);
            }
        }
    }
}